

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot_items.cpp
# Opt level: O1

void ImPlot::PlotScatterEx<ImPlot::GetterXsYs<float>>(char *label_id,GetterXsYs<float> *getter)

{
  double dVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  TransformerLogLog transformer;
  ImPlotPlot *pIVar7;
  double dVar8;
  ImPlotRange *pIVar9;
  ImPlotContext *pIVar10;
  bool bVar11;
  long lVar12;
  long lVar13;
  float *pfVar14;
  float *pfVar15;
  int iVar16;
  int iVar17;
  float fVar18;
  double dVar19;
  undefined4 uVar20;
  float fVar21;
  undefined4 uVar22;
  double dVar23;
  undefined8 local_98;
  float local_90;
  float local_8c;
  GetterXsYs<float> *local_88;
  undefined8 local_80;
  ImU32 local_74;
  ImU32 local_70;
  uint local_6c;
  long local_68;
  ulong local_60;
  float *local_58;
  float *local_50;
  undefined8 local_48;
  ImDrawList *local_40;
  long local_38;
  
  bVar11 = BeginItem(label_id,2);
  pIVar10 = GImPlot;
  if (bVar11) {
    if ((GImPlot->FitThisFrame == true) && (iVar2 = getter->Count, 0 < iVar2)) {
      pfVar14 = getter->Xs;
      pfVar15 = getter->Ys;
      iVar17 = getter->Offset;
      iVar3 = getter->Stride;
      pIVar7 = GImPlot->CurrentPlot;
      iVar4 = pIVar7->CurrentYAxis;
      uVar5 = (pIVar7->XAxis).Flags;
      pIVar9 = GImPlot->ExtentsY;
      uVar6 = pIVar7->YAxis[iVar4].Flags;
      iVar16 = 0;
      local_80 = CONCAT44(local_80._4_4_,uVar6) & 0xffffffff00000020;
      local_48 = (ImPlotContext *)(CONCAT44(local_48._4_4_,uVar5) & 0xffffffff00000020);
      do {
        lVar12 = (long)(((iVar17 + iVar16) % iVar2 + iVar2) % iVar2) * (long)iVar3;
        fVar18 = *(float *)((long)pfVar14 + lVar12);
        dVar19 = (double)fVar18;
        fVar21 = *(float *)((long)pfVar15 + lVar12);
        dVar8 = (double)fVar21;
        if ((uVar5 >> 10 & 1) == 0) {
          if ((long)ABS(dVar19) < 0x7ff0000000000000) {
LAB_001dae6e:
            if ((0.0 < fVar18) || ((int)local_48 == 0)) {
              dVar1 = (pIVar10->ExtentsX).Min;
              dVar23 = dVar19;
              if (dVar1 <= dVar19) {
                dVar23 = dVar1;
              }
              (pIVar10->ExtentsX).Min = dVar23;
              dVar1 = (pIVar10->ExtentsX).Max;
              dVar23 = dVar19;
              if (dVar19 <= dVar1) {
                dVar23 = dVar1;
              }
              (pIVar10->ExtentsX).Max = dVar23;
            }
          }
        }
        else if ((((long)ABS(dVar19) < 0x7ff0000000000000) &&
                 (pIVar7->YAxis[iVar4].Range.Min <= dVar8)) &&
                (dVar8 <= pIVar7->YAxis[iVar4].Range.Max)) goto LAB_001dae6e;
        if ((uVar6 >> 10 & 1) == 0) {
          if ((long)ABS(dVar8) < 0x7ff0000000000000) {
LAB_001daedc:
            if ((0.0 < fVar21) || ((int)local_80 == 0)) {
              uVar20 = SUB84(dVar8,0);
              uVar22 = (undefined4)((ulong)dVar8 >> 0x20);
              dVar19 = pIVar9[iVar4].Min;
              if (dVar19 <= dVar8) {
                uVar20 = SUB84(dVar19,0);
                uVar22 = (undefined4)((ulong)dVar19 >> 0x20);
              }
              pIVar9[iVar4].Min = (double)CONCAT44(uVar22,uVar20);
              dVar19 = pIVar10->ExtentsY[iVar4].Max;
              if (dVar8 <= dVar19) {
                dVar8 = dVar19;
              }
              pIVar10->ExtentsY[iVar4].Max = dVar8;
            }
          }
        }
        else if ((((long)ABS(dVar8) < 0x7ff0000000000000) && ((pIVar7->XAxis).Range.Min <= dVar19))
                && (dVar19 <= (pIVar7->XAxis).Range.Max)) goto LAB_001daedc;
        iVar16 = iVar16 + 1;
      } while (iVar2 != iVar16);
    }
    local_88 = getter;
    local_40 = GetPlotDrawList();
    iVar2 = (pIVar10->NextItemData).Marker;
    iVar17 = 0;
    if (iVar2 != -1) {
      iVar17 = iVar2;
    }
    PopPlotClipRect();
    PushPlotClipRect((pIVar10->NextItemData).MarkerSize);
    local_70 = ImGui::GetColorU32((pIVar10->NextItemData).Colors + 2);
    local_74 = ImGui::GetColorU32((pIVar10->NextItemData).Colors + 3);
    transformer.YAxis = GImPlot->CurrentPlot->CurrentYAxis;
    lVar12 = (long)transformer.YAxis;
    local_48 = GImPlot;
    local_80 = lVar12;
    switch(GImPlot->Scales[lVar12]) {
    case 0:
      iVar2 = local_88->Count;
      if (0 < iVar2) {
        pfVar14 = local_88->Xs;
        pfVar15 = local_88->Ys;
        iVar3 = local_88->Offset;
        local_60 = CONCAT44(local_60._4_4_,(pIVar10->NextItemData).MarkerSize);
        local_68 = CONCAT44(local_68._4_4_,(pIVar10->NextItemData).MarkerWeight);
        iVar4 = local_88->Stride;
        local_88 = (GetterXsYs<float> *)(long)iVar17;
        iVar17 = 0;
        local_8c = (float)(uint)(pIVar10->NextItemData).RenderMarkerLine;
        local_90 = (float)(uint)(pIVar10->NextItemData).RenderMarkerFill;
        local_58 = pfVar14;
        local_50 = pfVar15;
        do {
          lVar13 = (long)(((iVar3 + iVar17) % iVar2 + iVar2) % iVar2) * (long)iVar4;
          fVar18 = (float)(((double)*(float *)((long)pfVar14 + lVar13) -
                           (GImPlot->CurrentPlot->XAxis).Range.Min) * GImPlot->Mx +
                          (double)GImPlot->PixelRange[lVar12].Min.x);
          fVar21 = (float)(((double)*(float *)((long)pfVar15 + lVar13) -
                           GImPlot->CurrentPlot->YAxis[lVar12].Range.Min) * GImPlot->My[local_80] +
                          (double)GImPlot->PixelRange[lVar12].Min.y);
          local_98 = CONCAT44(fVar21,fVar18);
          pIVar7 = local_48->CurrentPlot;
          if ((((pIVar7->PlotRect).Min.x <= fVar18) && ((pIVar7->PlotRect).Min.y <= fVar21)) &&
             ((fVar18 < (pIVar7->PlotRect).Max.x && (fVar21 < (pIVar7->PlotRect).Max.y)))) {
            (**(code **)(RenderMarkers<ImPlot::TransformerLinLin,ImPlot::GetterXsYs<float>>(ImPlot::GetterXsYs<float>,ImPlot::TransformerLinLin,ImDrawList&,int,float,bool,unsigned_int,float,bool,unsigned_int)
                         ::marker_table + (long)local_88 * 8))
                      (local_60 & 0xffffffff,(undefined4)local_68,local_40,&local_98,local_8c,
                       local_70,local_90,local_74);
            pfVar14 = local_58;
            pfVar15 = local_50;
          }
          iVar17 = iVar17 + 1;
        } while (iVar2 != iVar17);
      }
      break;
    case 1:
      iVar2 = local_88->Count;
      if (0 < iVar2) {
        local_50 = local_88->Xs;
        local_58 = local_88->Ys;
        local_60 = (ulong)(uint)local_88->Offset;
        local_8c = (pIVar10->NextItemData).MarkerSize;
        local_90 = (pIVar10->NextItemData).MarkerWeight;
        local_68 = (long)local_88->Stride;
        local_38 = (long)iVar17;
        iVar17 = 0;
        local_6c = (uint)(pIVar10->NextItemData).RenderMarkerLine;
        bVar11 = (pIVar10->NextItemData).RenderMarkerFill;
        do {
          pIVar10 = GImPlot;
          lVar13 = ((((int)local_60 + iVar17) % iVar2 + iVar2) % iVar2) * local_68;
          local_88 = (GetterXsYs<float> *)(double)*(float *)((long)local_58 + lVar13);
          dVar19 = log10((double)*(float *)((long)local_50 + lVar13) /
                         (GImPlot->CurrentPlot->XAxis).Range.Min);
          pIVar7 = pIVar10->CurrentPlot;
          dVar8 = (pIVar7->XAxis).Range.Min;
          fVar18 = (float)((((double)(float)(dVar19 / pIVar10->LogDenX) *
                             ((pIVar7->XAxis).Range.Max - dVar8) + dVar8) - dVar8) * pIVar10->Mx +
                          (double)pIVar10->PixelRange[lVar12].Min.x);
          fVar21 = (float)(((double)local_88 - pIVar7->YAxis[lVar12].Range.Min) *
                           pIVar10->My[local_80] + (double)pIVar10->PixelRange[lVar12].Min.y);
          local_98 = CONCAT44(fVar21,fVar18);
          pIVar7 = local_48->CurrentPlot;
          if ((((pIVar7->PlotRect).Min.x <= fVar18) && ((pIVar7->PlotRect).Min.y <= fVar21)) &&
             ((fVar18 < (pIVar7->PlotRect).Max.x && (fVar21 < (pIVar7->PlotRect).Max.y)))) {
            (**(code **)(RenderMarkers<ImPlot::TransformerLogLin,ImPlot::GetterXsYs<float>>(ImPlot::GetterXsYs<float>,ImPlot::TransformerLogLin,ImDrawList&,int,float,bool,unsigned_int,float,bool,unsigned_int)
                         ::marker_table + local_38 * 8))
                      (local_8c,local_90,local_40,&local_98,local_6c,local_70,bVar11,local_74);
          }
          iVar17 = iVar17 + 1;
        } while (iVar2 != iVar17);
      }
      break;
    case 2:
      iVar2 = local_88->Count;
      if (0 < iVar2) {
        local_50 = local_88->Xs;
        local_58 = local_88->Ys;
        local_60 = (ulong)(uint)local_88->Offset;
        local_8c = (pIVar10->NextItemData).MarkerSize;
        local_90 = (pIVar10->NextItemData).MarkerWeight;
        local_68 = (long)local_88->Stride;
        local_38 = (long)iVar17;
        iVar17 = 0;
        local_6c = (uint)(pIVar10->NextItemData).RenderMarkerLine;
        bVar11 = (pIVar10->NextItemData).RenderMarkerFill;
        do {
          pIVar10 = GImPlot;
          lVar13 = ((((int)local_60 + iVar17) % iVar2 + iVar2) % iVar2) * local_68;
          local_88 = (GetterXsYs<float> *)(double)*(float *)((long)local_50 + lVar13);
          dVar19 = log10((double)*(float *)((long)local_58 + lVar13) /
                         GImPlot->CurrentPlot->YAxis[lVar12].Range.Min);
          pIVar7 = pIVar10->CurrentPlot;
          dVar8 = pIVar7->YAxis[lVar12].Range.Min;
          fVar21 = (float)(((double)local_88 - (pIVar7->XAxis).Range.Min) * pIVar10->Mx +
                          (double)pIVar10->PixelRange[lVar12].Min.x);
          fVar18 = (float)((((double)(float)(dVar19 / pIVar10->LogDenY[local_80]) *
                             (pIVar7->YAxis[lVar12].Range.Max - dVar8) + dVar8) - dVar8) *
                           pIVar10->My[local_80] + (double)pIVar10->PixelRange[lVar12].Min.y);
          local_98 = CONCAT44(fVar18,fVar21);
          pIVar7 = local_48->CurrentPlot;
          if (((((pIVar7->PlotRect).Min.x <= fVar21) && ((pIVar7->PlotRect).Min.y <= fVar18)) &&
              (fVar21 < (pIVar7->PlotRect).Max.x)) && (fVar18 < (pIVar7->PlotRect).Max.y)) {
            (**(code **)(RenderMarkers<ImPlot::TransformerLinLog,ImPlot::GetterXsYs<float>>(ImPlot::GetterXsYs<float>,ImPlot::TransformerLinLog,ImDrawList&,int,float,bool,unsigned_int,float,bool,unsigned_int)
                         ::marker_table + local_38 * 8))
                      (local_8c,local_90,local_40,&local_98,local_6c,local_70,bVar11,local_74);
          }
          iVar17 = iVar17 + 1;
        } while (iVar2 != iVar17);
      }
      break;
    case 3:
      RenderMarkers<ImPlot::TransformerLogLog,ImPlot::GetterXsYs<float>>
                (*local_88,transformer,local_40,iVar17,(pIVar10->NextItemData).MarkerSize,
                 (pIVar10->NextItemData).RenderMarkerLine,local_70,
                 (pIVar10->NextItemData).MarkerWeight,(pIVar10->NextItemData).RenderMarkerFill,
                 local_74);
    }
    pIVar10 = GImPlot;
    PopPlotClipRect();
    ImPlotNextItemData::Reset(&pIVar10->NextItemData);
    pIVar10->PreviousItem = pIVar10->CurrentItem;
    pIVar10->CurrentItem = (ImPlotItem *)0x0;
  }
  return;
}

Assistant:

inline void PlotScatterEx(const char* label_id, const Getter& getter) {
    if (BeginItem(label_id, ImPlotCol_MarkerOutline)) {
        if (FitThisFrame()) {
            for (int i = 0; i < getter.Count; ++i) {
                ImPlotPoint p = getter(i);
                FitPoint(p);
            }
        }
        const ImPlotNextItemData& s = GetItemData();
        ImDrawList& DrawList = *GetPlotDrawList();
        // render markers
        ImPlotMarker marker = s.Marker == ImPlotMarker_None ? ImPlotMarker_Circle : s.Marker;
        if (marker != ImPlotMarker_None) {
            PopPlotClipRect();
            PushPlotClipRect(s.MarkerSize);
            const ImU32 col_line = ImGui::GetColorU32(s.Colors[ImPlotCol_MarkerOutline]);
            const ImU32 col_fill = ImGui::GetColorU32(s.Colors[ImPlotCol_MarkerFill]);
            switch (GetCurrentScale()) {
                case ImPlotScale_LinLin: RenderMarkers(getter, TransformerLinLin(), DrawList, marker, s.MarkerSize, s.RenderMarkerLine, col_line, s.MarkerWeight, s.RenderMarkerFill, col_fill); break;
                case ImPlotScale_LogLin: RenderMarkers(getter, TransformerLogLin(), DrawList, marker, s.MarkerSize, s.RenderMarkerLine, col_line, s.MarkerWeight, s.RenderMarkerFill, col_fill); break;
                case ImPlotScale_LinLog: RenderMarkers(getter, TransformerLinLog(), DrawList, marker, s.MarkerSize, s.RenderMarkerLine, col_line, s.MarkerWeight, s.RenderMarkerFill, col_fill); break;
                case ImPlotScale_LogLog: RenderMarkers(getter, TransformerLogLog(), DrawList, marker, s.MarkerSize, s.RenderMarkerLine, col_line, s.MarkerWeight, s.RenderMarkerFill, col_fill); break;
            }
        }
        EndItem();
    }
}